

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<unsigned_int>(BinaryWriter *this,uint value)

{
  vector<char,std::allocator<char>> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  const_iterator local_20;
  uint local_18;
  uint local_14;
  char buffer [4];
  uint value_local;
  BinaryWriter *this_local;
  
  this_00 = (vector<char,std::allocator<char>> *)this->buffer_;
  local_18 = value;
  local_14 = value;
  _buffer = this;
  local_28._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_20,
             &local_28);
  std::vector<char,std::allocator<char>>::insert<char*,void>
            (this_00,local_20,(char *)&local_18,(char *)&local_14);
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(value)];
            memcpy(buffer, &value, sizeof(value));
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(buffer));
        }